

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

int ncnn::eval_list_expression
              (string *expr,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blobs,
              vector<int,_std::allocator<int>_> *outlist)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  pointer pMVar5;
  undefined8 __lhs_00;
  pointer pbVar6;
  bool bVar7;
  anon_union_4_2_947300a4_for_typed_value_1 aVar8;
  int iVar9;
  int iVar10;
  _Elt_pointer ptVar11;
  uint uVar12;
  anon_union_4_2_947300a4_for_typed_value_1 aVar13;
  anon_union_4_2_947300a4_for_typed_value_1 aVar14;
  size_t i;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  anon_union_4_2_947300a4_for_typed_value_1 local_d4;
  int size;
  anon_union_4_2_947300a4_for_typed_value_1 local_cc;
  undefined1 local_c8 [16];
  anon_union_4_2_947300a4_for_typed_value_1 local_b4;
  stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
  exprstack;
  float vf;
  int vi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
  super__Deque_impl_data._M_map =
       &exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
        .super__Deque_impl_data._M_start._M_cur;
  exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur._0_1_ = 0;
  for (uVar15 = 0; uVar15 < expr->_M_string_length; uVar15 = uVar15 + 1) {
    uVar17 = (ulong)(byte)(expr->_M_dataplus)._M_p[uVar15];
    if ((uVar17 < 0x2d) && ((0x130000000000U >> (uVar17 & 0x3f) & 1) != 0)) {
      if (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
          _M_impl.super__Deque_impl_data._M_map_size != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tokens,(value_type *)&exprstack);
        exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
        .super__Deque_impl_data._M_map_size = 0;
        *(undefined1 *)
         exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
         _M_impl.super__Deque_impl_data._M_map = 0;
      }
    }
    else {
      std::__cxx11::string::push_back((char)(value_type *)&exprstack);
    }
  }
  if (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
      super__Deque_impl_data._M_map_size != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&tokens,(value_type *)&exprstack);
  }
  std::__cxx11::string::~string((string *)&exprstack);
  std::stack<ncnn::typed_value,std::deque<ncnn::typed_value,std::allocator<ncnn::typed_value>>>::
  stack<std::deque<ncnn::typed_value,std::allocator<ncnn::typed_value>>,void>(&exprstack);
  uVar17 = (ulong)((long)tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar15 = (long)tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0x1fffffffe0;
  do {
    pbVar6 = tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = uVar15 - 0x20;
    if ((int)uVar17 < 1) {
      ptVar11 = exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        ptVar11 = exprstack.c.
                  super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      size = (int)ptVar11[-1].field_1.f;
      if (ptVar11[-1].type == 0) {
        size = (int)ptVar11[-1].field_1.f;
      }
      std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back(&exprstack.c);
      std::vector<int,_std::allocator<int>_>::push_back(outlist,&size);
      while (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (_Elt_pointer)
             CONCAT71(exprstack.c.
                      super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur._1_7_,
                      exprstack.c.
                      super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur._0_1_)) {
        ptVar11 = exprstack.c.
                  super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ptVar11 = exprstack.c.
                    super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        size = (int)ptVar11[-1].field_1.f;
        if (ptVar11[-1].type == 0) {
          size = (int)ptVar11[-1].field_1.f;
        }
        std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back(&exprstack.c);
        std::vector<int,_std::allocator<int>_>::push_back(outlist,&size);
      }
      iVar9 = 0;
LAB_00535efa:
      std::_Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::~_Deque_base
                ((_Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)&exprstack);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      return iVar9;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p + uVar15);
    if (*(long *)((long)&tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + uVar15) !=
        2) {
LAB_00534f62:
      bVar7 = std::operator==(__lhs,"+");
      if (bVar7) {
LAB_00534fd8:
        local_c8._0_8_ = uVar16;
        ptVar11 = exprstack.c.
                  super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ptVar11 = exprstack.c.
                    super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        iVar9 = ptVar11[-1].type;
        aVar8 = (anon_union_4_2_947300a4_for_typed_value_1)ptVar11[-1].field_1.i;
        std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back(&exprstack.c);
        ptVar11 = exprstack.c.
                  super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ptVar11 = exprstack.c.
                    super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        iVar10 = ptVar11[-1].type;
        local_d4 = (anon_union_4_2_947300a4_for_typed_value_1)ptVar11[-1].field_1.f;
        std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back(&exprstack.c);
        if (iVar9 == 0 && iVar10 == 0) {
          bVar7 = std::operator==(__lhs,"+");
          if (bVar7) {
LAB_00535086:
            uVar16 = local_c8._0_8_;
            local_cc.i = local_d4.i + aVar8.i;
          }
          else {
            bVar7 = std::operator==(__lhs,"-");
            if (bVar7) {
              local_d4.i = -local_d4.i;
              goto LAB_00535086;
            }
            bVar7 = std::operator==(__lhs,"*");
            uVar16 = local_c8._0_8_;
            if (bVar7) {
              local_cc.i = local_d4.i * aVar8.i;
            }
            else {
              bVar7 = std::operator==(__lhs,"//");
              if (bVar7) {
                if ((float)local_d4.i == 0.0) {
                  fwrite("expr divide by zero",0x13,1,_stderr);
                  goto LAB_00535f3f;
                }
                local_cc.i = aVar8.i / local_d4.i;
              }
              else {
                bVar7 = std::operator==(__lhs,"max");
                local_cc = local_d4;
                if (bVar7) {
                  if (local_d4.i < aVar8.i) {
                    local_cc = aVar8;
                  }
                }
                else if (aVar8.i <= local_d4.i) {
                  local_cc = aVar8;
                }
              }
            }
          }
          size = 0;
          std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
          emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
        }
        else {
          local_b4 = aVar8;
          if (iVar9 == 0) {
            local_b4.f = (float)aVar8.i;
          }
          if (iVar10 == 0) {
            local_d4.f = (float)local_d4.i;
          }
          uVar16 = local_c8._0_8_;
          bVar7 = std::operator==(__lhs,"+");
          if (bVar7) {
            local_d4.f = local_d4.f + local_b4.f;
          }
          else {
            bVar7 = std::operator==(__lhs,"-");
            if (bVar7) {
              local_d4.f = local_b4.f - local_d4.f;
            }
            else {
              bVar7 = std::operator==(__lhs,"*");
              if (bVar7) {
                local_d4.f = local_d4.f * local_b4.f;
              }
              else {
                bVar7 = std::operator==(__lhs,"//");
                if (bVar7) {
                  local_d4.f = floorf(local_b4.f / local_d4.f);
                }
                else {
                  bVar7 = std::operator==(__lhs,"max");
                  if (bVar7) {
                    if (local_d4.f <= local_b4.f) {
                      local_d4 = local_b4;
                    }
                  }
                  else if (local_b4.f <= local_d4.f) {
                    local_d4 = local_b4;
                  }
                }
              }
            }
          }
          size = 1;
          local_cc = local_d4;
          std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
          emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
        }
      }
      else {
        bVar7 = std::operator==(__lhs,"-");
        if (bVar7) goto LAB_00534fd8;
        bVar7 = std::operator==(__lhs,"*");
        if (bVar7) goto LAB_00534fd8;
        bVar7 = std::operator==(__lhs,"//");
        if (bVar7) goto LAB_00534fd8;
        bVar7 = std::operator==(__lhs,"max");
        if (bVar7) goto LAB_00534fd8;
        bVar7 = std::operator==(__lhs,"min");
        if (bVar7) goto LAB_00534fd8;
        bVar7 = std::operator==(__lhs,"abs");
        if ((((bVar7) || (bVar7 = std::operator==(__lhs,"neg"), bVar7)) ||
            (bVar7 = std::operator==(__lhs,"sign"), bVar7)) ||
           (bVar7 = std::operator==(__lhs,"square"), bVar7)) {
          ptVar11 = exprstack.c.
                    super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_cur;
          if (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur ==
              exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first) {
            ptVar11 = exprstack.c.
                      super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          aVar8 = (anon_union_4_2_947300a4_for_typed_value_1)ptVar11[-1].field_1.i;
          iVar9 = ptVar11[-1].type;
          std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back(&exprstack.c);
          if (iVar9 == 0) {
            bVar7 = std::operator==(__lhs,"abs");
            if (bVar7) {
              local_cc.i = -aVar8.i;
              if (0 < aVar8.i) {
                local_cc = aVar8;
              }
            }
            else {
              bVar7 = std::operator==(__lhs,"neg");
              if (bVar7) {
                local_cc.i = -aVar8.i;
              }
              else {
                bVar7 = std::operator==(__lhs,"sign");
                if (bVar7) {
                  local_cc.i = -(uint)((float)aVar8.i != 0.0);
                  if (0 < aVar8.i) {
                    local_cc.i = 1;
                  }
                }
                else {
                  local_cc.i = aVar8.i * aVar8.i;
                }
              }
            }
            size = 0;
            std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
            emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
          }
          else {
            local_c8 = ZEXT416((uint)aVar8.i);
            bVar7 = std::operator==(__lhs,"abs");
            if (bVar7) {
              local_cc.i = local_c8._0_4_ & 0x7fffffff;
            }
            else {
              bVar7 = std::operator==(__lhs,"neg");
              if (bVar7) {
                local_cc.i = local_c8._0_4_ ^ 0x80000000;
              }
              else {
                bVar7 = std::operator==(__lhs,"sign");
                if (bVar7) {
                  local_cc.i = -(uint)(0.0 < (float)local_c8._0_4_) & 0x3f800000 |
                               ~-(uint)(0.0 < (float)local_c8._0_4_) &
                               -(uint)((float)local_c8._0_4_ != 0.0) & 0xbf800000;
                }
                else {
                  local_cc.f = (float)local_c8._0_4_ * (float)local_c8._0_4_;
                }
              }
            }
            size = 1;
            std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
            emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
          }
          goto LAB_00535368;
        }
        bVar7 = std::operator==(__lhs,"trunc");
        if (bVar7) {
LAB_005354c5:
          local_c8._0_8_ = __lhs;
          ptVar11 = exprstack.c.
                    super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_cur;
          if (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur ==
              exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first) {
            ptVar11 = exprstack.c.
                      super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          aVar8 = (anon_union_4_2_947300a4_for_typed_value_1)ptVar11[-1].field_1.f;
          iVar9 = ptVar11[-1].type;
          std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back(&exprstack.c);
          if (iVar9 == 0) {
            size = 0;
            local_cc = aVar8;
            std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
            emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
          }
          else {
            __lhs_00 = local_c8._0_8_;
            bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8._0_8_,"trunc");
            if (!bVar7) {
              bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs_00,"ceil");
              if (bVar7) {
                aVar8.f = ceilf(aVar8.f);
              }
              else {
                bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs_00,"floor");
                if (bVar7) {
                  aVar8.f = floorf(aVar8.f);
                }
                else {
                  aVar8.f = roundf(aVar8.f);
                }
              }
            }
            local_cc.i = (int)aVar8.f;
            size = 0;
            std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
            emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
          }
        }
        else {
          bVar7 = std::operator==(__lhs,"ceil");
          if (bVar7) goto LAB_005354c5;
          bVar7 = std::operator==(__lhs,"floor");
          if (bVar7) goto LAB_005354c5;
          bVar7 = std::operator==(__lhs,"round");
          if (bVar7) goto LAB_005354c5;
          bVar7 = std::operator==(__lhs,"acos");
          if ((((((bVar7) || (bVar7 = std::operator==(__lhs,"acosh"), bVar7)) ||
                ((bVar7 = std::operator==(__lhs,"asin"), bVar7 ||
                 ((bVar7 = std::operator==(__lhs,"asinh"), bVar7 ||
                  (bVar7 = std::operator==(__lhs,"atan"), bVar7)))))) ||
               ((bVar7 = std::operator==(__lhs,"atanh"), bVar7 ||
                (((((bVar7 = std::operator==(__lhs,"cos"), bVar7 ||
                    (bVar7 = std::operator==(__lhs,"cosh"), bVar7)) ||
                   (bVar7 = std::operator==(__lhs,"erf"), bVar7)) ||
                  ((bVar7 = std::operator==(__lhs,"exp"), bVar7 ||
                   (bVar7 = std::operator==(__lhs,"log"), bVar7)))) ||
                 (((bVar7 = std::operator==(__lhs,"log10"), bVar7 ||
                   ((bVar7 = std::operator==(__lhs,"reciprocal"), bVar7 ||
                    (bVar7 = std::operator==(__lhs,"rsqrt"), bVar7)))) ||
                  (bVar7 = std::operator==(__lhs,"sin"), bVar7)))))))) ||
              (((bVar7 = std::operator==(__lhs,"sinh"), bVar7 ||
                (bVar7 = std::operator==(__lhs,"sqrt"), bVar7)) ||
               (bVar7 = std::operator==(__lhs,"tan"), bVar7)))) ||
             (bVar7 = std::operator==(__lhs,"tanh"), bVar7)) {
            ptVar11 = exprstack.c.
                      super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                exprstack.c.super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ptVar11 = exprstack.c.
                        super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            fVar18 = (float)ptVar11[-1].field_1.i;
            if (ptVar11[-1].type == 0) {
              fVar18 = (float)(int)fVar18;
            }
            local_c8._0_4_ = fVar18;
            std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back
                      (&exprstack.c);
            bVar7 = std::operator==(__lhs,"acos");
            if (bVar7) {
              local_cc.f = acosf((float)local_c8._0_4_);
            }
            else {
              bVar7 = std::operator==(__lhs,"acosh");
              if (bVar7) {
                local_cc.f = acoshf((float)local_c8._0_4_);
              }
              else {
                bVar7 = std::operator==(__lhs,"asin");
                if (bVar7) {
                  local_cc.f = asinf((float)local_c8._0_4_);
                }
                else {
                  bVar7 = std::operator==(__lhs,"asinh");
                  if (bVar7) {
                    local_cc.f = asinhf((float)local_c8._0_4_);
                  }
                  else {
                    bVar7 = std::operator==(__lhs,"atan");
                    if (bVar7) {
                      local_cc.f = atanf((float)local_c8._0_4_);
                    }
                    else {
                      bVar7 = std::operator==(__lhs,"atanh");
                      if (bVar7) {
                        local_cc.f = atanhf((float)local_c8._0_4_);
                      }
                      else {
                        bVar7 = std::operator==(__lhs,"cos");
                        if (bVar7) {
                          local_cc.f = cosf((float)local_c8._0_4_);
                        }
                        else {
                          bVar7 = std::operator==(__lhs,"cosh");
                          if (bVar7) {
                            local_cc.f = coshf((float)local_c8._0_4_);
                          }
                          else {
                            bVar7 = std::operator==(__lhs,"erf");
                            if (bVar7) {
                              local_cc.f = erff((float)local_c8._0_4_);
                            }
                            else {
                              bVar7 = std::operator==(__lhs,"exp");
                              if (bVar7) {
                                local_cc.f = expf((float)local_c8._0_4_);
                              }
                              else {
                                bVar7 = std::operator==(__lhs,"log");
                                if (bVar7) {
                                  local_cc.f = logf((float)local_c8._0_4_);
                                }
                                else {
                                  bVar7 = std::operator==(__lhs,"log10");
                                  if (bVar7) {
                                    local_cc.f = log10f((float)local_c8._0_4_);
                                  }
                                  else {
                                    bVar7 = std::operator==(__lhs,"reciprocal");
                                    if (bVar7) {
                                      local_cc.f = 1.0 / (float)local_c8._0_4_;
                                    }
                                    else {
                                      bVar7 = std::operator==(__lhs,"rsqrt");
                                      if (bVar7) {
                                        local_cc.f = 1.0 / SQRT((float)local_c8._0_4_);
                                      }
                                      else {
                                        bVar7 = std::operator==(__lhs,"sin");
                                        if (bVar7) {
                                          local_cc.f = sinf((float)local_c8._0_4_);
                                        }
                                        else {
                                          bVar7 = std::operator==(__lhs,"sinh");
                                          if (bVar7) {
                                            local_cc.f = sinhf((float)local_c8._0_4_);
                                          }
                                          else {
                                            bVar7 = std::operator==(__lhs,"sqrt");
                                            if (bVar7) {
                                              local_cc.f = SQRT((float)local_c8._0_4_);
                                            }
                                            else {
                                              bVar7 = std::operator==(__lhs,"tan");
                                              if (bVar7) {
                                                local_cc.f = tanf((float)local_c8._0_4_);
                                              }
                                              else {
                                                local_cc.f = tanhf((float)local_c8._0_4_);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            size = 1;
            std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
            emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
          }
          else {
            bVar7 = std::operator==(__lhs,"/");
            if ((((bVar7) || (bVar7 = std::operator==(__lhs,"atan2"), bVar7)) ||
                ((bVar7 = std::operator==(__lhs,"fmod"), bVar7 ||
                 ((bVar7 = std::operator==(__lhs,"pow"), bVar7 ||
                  (bVar7 = std::operator==(__lhs,"remainder"), bVar7)))))) ||
               (bVar7 = std::operator==(__lhs,"logaddexp"), bVar7)) {
              ptVar11 = exprstack.c.
                        super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (exprstack.c.
                  super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  exprstack.c.
                  super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
                ptVar11 = exprstack.c.
                          super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              iVar9 = ptVar11[-1].type;
              local_d4 = (anon_union_4_2_947300a4_for_typed_value_1)ptVar11[-1].field_1.f;
              std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back
                        (&exprstack.c);
              ptVar11 = exprstack.c.
                        super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (exprstack.c.
                  super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  exprstack.c.
                  super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
                ptVar11 = exprstack.c.
                          super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              fVar18 = (float)ptVar11[-1].field_1.i;
              if (ptVar11[-1].type == 0) {
                fVar18 = (float)(int)fVar18;
              }
              local_c8._0_4_ = fVar18;
              std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back
                        (&exprstack.c);
              if (iVar9 == 0) {
                local_d4.f = (float)local_d4.i;
              }
              bVar7 = std::operator==(__lhs,"/");
              if (bVar7) {
                local_cc.i = (int)(local_d4.i / (float)local_c8._0_4_);
              }
              else {
                bVar7 = std::operator==(__lhs,"atan2");
                if (bVar7) {
                  local_cc.i = (int)atan2f(local_d4.i,(float)local_c8._0_4_);
                }
                else {
                  bVar7 = std::operator==(__lhs,"fmod");
                  if (bVar7) {
                    local_cc.i = (int)fmodf(local_d4.i,(float)local_c8._0_4_);
                  }
                  else {
                    bVar7 = std::operator==(__lhs,"pow");
                    if (bVar7) {
                      local_cc.i = (int)powf(local_d4.i,(float)local_c8._0_4_);
                    }
                    else {
                      bVar7 = std::operator==(__lhs,"remainder");
                      if (bVar7) {
                        local_cc.i = (int)fmodf(local_d4.i,(float)local_c8._0_4_);
                        if (local_d4.f * (float)local_c8._0_4_ < 0.0) {
                          local_cc.f = local_cc.f + (float)local_c8._0_4_;
                        }
                      }
                      else {
                        fVar18 = expf(local_d4.f);
                        fVar19 = expf((float)local_c8._0_4_);
                        local_cc.f = logf(fVar19 + fVar18);
                      }
                    }
                  }
                }
              }
              size = 1;
              std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
              emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
            }
            else {
              bVar7 = std::operator==(__lhs,"and");
              if ((((bVar7) || (bVar7 = std::operator==(__lhs,"or"), bVar7)) ||
                  (bVar7 = std::operator==(__lhs,"xor"), bVar7)) ||
                 ((bVar7 = std::operator==(__lhs,"lshift"), bVar7 ||
                  (bVar7 = std::operator==(__lhs,"rshift"), bVar7)))) {
                ptVar11 = exprstack.c.
                          super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (exprstack.c.
                    super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_cur ==
                    exprstack.c.
                    super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_first) {
                  ptVar11 = exprstack.c.
                            super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                }
                uVar12 = ptVar11[-1].field_1.i;
                std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back
                          (&exprstack.c);
                ptVar11 = exprstack.c.
                          super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (exprstack.c.
                    super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_cur ==
                    exprstack.c.
                    super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_first) {
                  ptVar11 = exprstack.c.
                            super__Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                }
                uVar3 = ptVar11[-1].field_1.i;
                std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::pop_back
                          (&exprstack.c);
                bVar7 = std::operator==(__lhs,"and");
                if (bVar7) {
                  local_cc.i = uVar3 & uVar12;
                }
                else {
                  bVar7 = std::operator==(__lhs,"or");
                  if (bVar7) {
                    local_cc.i = uVar3 | uVar12;
                  }
                  else {
                    bVar7 = std::operator==(__lhs,"xor");
                    if (bVar7) {
                      local_cc.i = uVar3 ^ uVar12;
                    }
                    else {
                      bVar7 = std::operator==(__lhs,"lshift");
                      if (bVar7) {
                        local_cc.i = uVar12 << ((byte)uVar3 & 0x1f);
                      }
                      else {
                        local_cc.i = (int)uVar12 >> ((byte)uVar3 & 0x1f);
                      }
                    }
                  }
                }
                size = 0;
                std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
              }
              else {
                iVar9 = __isoc99_sscanf((__lhs->_M_dataplus)._M_p,"%d",&vi);
                iVar10 = __isoc99_sscanf((__lhs->_M_dataplus)._M_p,"%f",&vf);
                if (iVar10 == 1 && iVar9 == 1) {
                  if ((float)vi == vf) {
                    size = 0;
                    local_cc.i = vi;
                    std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                    emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
                    goto LAB_00535368;
                  }
                }
                else if (iVar10 != 1) {
                  fprintf(_stderr,"malformed literal token %s",
                          *(undefined8 *)((long)&pbVar6[-1]._M_dataplus._M_p + uVar15));
                  goto LAB_00535f3f;
                }
                size = 1;
                local_cc.f = vf;
                std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
              }
            }
          }
        }
      }
      goto LAB_00535368;
    }
    pbVar4 = (byte *)(__lhs->_M_dataplus)._M_p;
    bVar1 = *pbVar4;
    if (9 < (byte)(bVar1 - 0x30)) goto LAB_00534f62;
    bVar2 = pbVar4[1];
    if ((0x14 < bVar2 - 99) || ((0x100023U >> (bVar2 - 99 & 0x1f) & 1) == 0)) goto LAB_00534f62;
    uVar12 = bVar1 - 0x30;
    uVar15 = (ulong)uVar12;
    pMVar5 = (blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pMVar5) / 0x48) <= uVar15) {
      fprintf(_stderr,"shape expression blob index %d out of bound!",(ulong)uVar12);
LAB_00535f3f:
      fputc(10,_stderr);
      iVar9 = -1;
      goto LAB_00535efa;
    }
    switch(pMVar5[uVar15].dims) {
    case 1:
      aVar8.i = pMVar5[uVar15].elempack * pMVar5[uVar15].w;
      aVar13.i = 1;
      goto LAB_005351f0;
    case 2:
      aVar8 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar5[uVar15].w;
      aVar13.i = pMVar5[uVar15].elempack * pMVar5[uVar15].h;
LAB_005351f0:
      aVar14.i = 1;
      local_cc.i = aVar14.i;
      break;
    case 3:
      aVar8 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar5[uVar15].w;
      aVar13 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar5[uVar15].h;
      aVar14.i = pMVar5[uVar15].elempack * pMVar5[uVar15].c;
      local_cc.i = 1;
      break;
    case 4:
      aVar8 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar5[uVar15].w;
      aVar13 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar5[uVar15].h;
      aVar14.i = pMVar5[uVar15].elempack * pMVar5[uVar15].c;
      local_cc.i = pMVar5[uVar15].d;
      break;
    default:
      aVar8.i = 0;
      aVar13.i = 0;
      aVar14.i = 0;
      local_cc.i = 0;
    }
    if (((bVar2 != 100) && (local_cc = aVar13, bVar2 != 0x68)) && (local_cc = aVar8, bVar2 != 0x77))
    {
      local_cc = aVar14;
    }
    size = 0;
    std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
    emplace_back<ncnn::typed_value>(&exprstack.c,(typed_value *)&size);
LAB_00535368:
    uVar17 = (ulong)((int)uVar17 - 1);
    uVar15 = uVar16;
  } while( true );
}

Assistant:

int eval_list_expression(const std::string& expr, const std::vector<Mat>& blobs, std::vector<int>& outlist)
{
    // /(0w,2),*(0h,2),0c

    // split by , ( )
    //
    //     /
    //         0w
    //         2
    // -------------------
    //     *
    //         0h
    //         2
    // -------------------
    //     0c
    // -------------------

    // split by , ( )

    // split into tokens
    std::vector<std::string> tokens;
    {
        std::string t;
        for (size_t i = 0; i < expr.size(); i++)
        {
            char ch = expr[i];

            if (ch == '(' || ch == ')' || ch == ',')
            {
                if (!t.empty())
                {
                    tokens.push_back(t);
                    t.clear();
                }
            }
            else
            {
#if NCNN_SIMPLESTL
                t.resize(t.size() + 1);
                t[t.size() - 1] = ch;
#else
                t += ch;
#endif
            }
        }

        if (!t.empty())
        {
            tokens.push_back(t);
        }
    }

    //      / 0w 2 * 0h 2 0c

    // scan and stack
    std::stack<typed_value> exprstack;
    for (int i = (int)tokens.size() - 1; i >= 0; i--)
    {
        const std::string& t = tokens[i];

        // NCNN_LOGE("t = %s", t.c_str());

        // + - * / 0w 0h 0d 0c 12345

        if (t.size() == 2 && (t[0] >= '0' && t[0] <= '9') && (t[1] == 'w' || t[1] == 'h' || t[1] == 'd' || t[1] == 'c'))
        {
            size_t blob_index = t[0] - '0';
            if (blob_index >= blobs.size())
            {
                NCNN_LOGE("shape expression blob index %d out of bound!", (int)blob_index);
                return -1;
            }

            const Mat& blob = blobs[blob_index].shape();
            int size;
            if (t[1] == 'w')
                size = blob.w;
            else if (t[1] == 'h')
                size = blob.h;
            else if (t[1] == 'd')
                size = blob.d;
            else // if (t[1] == 'c')
                size = blob.c;

            // NCNN_LOGE("t = %s  =>  %d", t.c_str(), size);

            exprstack.push(size);
        }
        else if (t == "+" || t == "-" || t == "*" || t == "//" || t == "max" || t == "min")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();
            typed_value tb = exprstack.top();
            exprstack.pop();

            if (ta.type == 0 && tb.type == 0)
            {
                const int a = ta.i;
                const int b = tb.i;

                int r = 0;
                if (t == "+")
                {
                    r = a + b;
                }
                else if (t == "-")
                {
                    r = a - b;
                }
                else if (t == "*")
                {
                    r = a * b;
                }
                else if (t == "//")
                {
                    if (b == 0)
                    {
                        NCNN_LOGE("expr divide by zero");
                        return -1;
                    }
                    else
                    {
                        r = a / b;
                    }
                }
                else if (t == "max")
                {
                    r = std::max(a, b);
                }
                else // if (t == "min")
                {
                    r = std::min(a, b);
                }
                exprstack.push(r);
            }
            else
            {
                const float a = ta.type == 0 ? ta.i : ta.f;
                const float b = tb.type == 0 ? tb.i : tb.f;

                float r = 0.f;
                if (t == "+")
                {
                    r = a + b;
                }
                else if (t == "-")
                {
                    r = a - b;
                }
                else if (t == "*")
                {
                    r = a * b;
                }
                else if (t == "//")
                {
                    r = floorf(a / b);
                }
                else if (t == "max")
                {
                    r = std::max(a, b);
                }
                else // if (t == "min")
                {
                    r = std::min(a, b);
                }
                exprstack.push(r);
            }
        }
        else if (t == "abs" || t == "neg" || t == "sign" || t == "square")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();

            if (ta.type == 0)
            {
                const int a = ta.i;

                int r = 0;
                if (t == "abs")
                {
                    r = a > 0 ? a : -a;
                }
                else if (t == "neg")
                {
                    r = -a;
                }
                else if (t == "sign")
                {
                    r = a > 0 ? 1 : (a == 0 ? 0 : -1);
                }
                else // if (t == "square")
                {
                    r = a * a;
                }
                exprstack.push(r);
            }
            else
            {
                const float a = ta.f;

                float r = 0;
                if (t == "abs")
                {
                    r = fabsf(a);
                }
                else if (t == "neg")
                {
                    r = -a;
                }
                else if (t == "sign")
                {
                    r = a > 0.f ? 1 : (a == 0.f ? 0 : -1);
                }
                else // if (t == "square")
                {
                    r = a * a;
                }
                exprstack.push(r);
            }
        }
        else if (t == "trunc" || t == "ceil" || t == "floor" || t == "round")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();

            if (ta.type == 0)
            {
                const int a = ta.i;
                exprstack.push(a);
            }
            else
            {
                const float a = ta.f;

                int r = 0;
                if (t == "trunc")
                {
                    r = (int)a;
                }
                else if (t == "ceil")
                {
                    r = (int)ceil(a);
                }
                else if (t == "floor")
                {
                    r = (int)floor(a);
                }
                else // if (t == "round")
                {
                    r = (int)round(a);
                }
                exprstack.push(r);
            }
        }
        else if (t == "acos"
                 || t == "acosh"
                 || t == "asin"
                 || t == "asinh"
                 || t == "atan"
                 || t == "atanh"
                 || t == "cos"
                 || t == "cosh"
                 || t == "erf"
                 || t == "exp"
                 || t == "log"
                 || t == "log10"
                 || t == "reciprocal"
                 || t == "rsqrt"
                 || t == "sin"
                 || t == "sinh"
                 || t == "sqrt"
                 || t == "tan"
                 || t == "tanh")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();

            const float a = ta.type == 0 ? ta.i : ta.f;

            float r = 0;
            if (t == "acos")
            {
                r = acosf(a);
            }
            else if (t == "acosh")
            {
                r = acoshf(a);
            }
            else if (t == "asin")
            {
                r = asinf(a);
            }
            else if (t == "asinh")
            {
                r = asinhf(a);
            }
            else if (t == "atan")
            {
                r = atanf(a);
            }
            else if (t == "atanh")
            {
                r = atanhf(a);
            }
            else if (t == "cos")
            {
                r = cosf(a);
            }
            else if (t == "cosh")
            {
                r = coshf(a);
            }
            else if (t == "erf")
            {
                r = erff(a);
            }
            else if (t == "exp")
            {
                r = expf(a);
            }
            else if (t == "log")
            {
                r = logf(a);
            }
            else if (t == "log10")
            {
                r = log10f(a);
            }
            else if (t == "reciprocal")
            {
                r = 1.f / a;
            }
            else if (t == "rsqrt")
            {
                r = 1.f / sqrtf(a);
            }
            else if (t == "sin")
            {
                r = sinf(a);
            }
            else if (t == "sinh")
            {
                r = sinhf(a);
            }
            else if (t == "sqrt")
            {
                r = sqrtf(a);
            }
            else if (t == "tan")
            {
                r = tanf(a);
            }
            else // if (t == "tanh")
            {
                r = tanhf(a);
            }
            exprstack.push(r);
        }
        else if (t == "/"
                 || t == "atan2"
                 || t == "fmod"
                 || t == "pow"
                 || t == "remainder"
                 || t == "logaddexp")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();
            typed_value tb = exprstack.top();
            exprstack.pop();

            const float a = ta.type == 0 ? ta.i : ta.f;
            const float b = tb.type == 0 ? tb.i : tb.f;

            float r = 0.f;
            if (t == "/")
            {
                r = a / b;
            }
            else if (t == "atan2")
            {
                r = atan2f(a, b);
            }
            else if (t == "fmod")
            {
                r = fmodf(a, b);
            }
            else if (t == "pow")
            {
                r = powf(a, b);
            }
            else if (t == "remainder")
            {
                r = fmodf(a, b);
                if (a * b < 0)
                    r += b;
            }
            else // if (t == "logaddexp")
            {
                r = logf(expf(a) + expf(b));
            }
            exprstack.push(r);
        }
        else if (t == "and" || t == "or" || t == "xor" || t == "lshift" || t == "rshift")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();
            typed_value tb = exprstack.top();
            exprstack.pop();

            // assert ta.type == 0 && tb.type == 0

            const int a = ta.i;
            const int b = tb.i;

            int r = 0;
            if (t == "and")
            {
                r = a & b;
            }
            else if (t == "or")
            {
                r = a | b;
            }
            else if (t == "xor")
            {
                r = a ^ b;
            }
            else if (t == "lshift")
            {
                r = a << b;
            }
            else // if (t == "rshift")
            {
                r = a >> b;
            }
            exprstack.push(r);
        }
        else
        {
            // literal
            int vi;
            float vf;
            int nscani = sscanf(t.c_str(), "%d", &vi);
            int nscanf = sscanf(t.c_str(), "%f", &vf);
            if (nscani == 1 && nscanf == 1 && vi == vf)
            {
                exprstack.push(vi);
            }
            else if (nscanf == 1)
            {
                exprstack.push(vf);
            }
            else
            {
                NCNN_LOGE("malformed literal token %s", t.c_str());
                return -1;
            }
        }
    }

    int size = exprstack.top().to_int();
    exprstack.pop();
    outlist.push_back(size);
    while (!exprstack.empty())
    {
        size = exprstack.top().to_int();
        exprstack.pop();
        outlist.push_back(size);
    }

    // NCNN_LOGE("shape %s = %d %d", expr.c_str(), list[0], list[1]);

    return 0;
}